

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O3

void __thiscall
embree::barrier_sys_regression_test::barrier_sys_regression_test(barrier_sys_regression_test *this)

{
  RegressionTest *test;
  long local_40;
  
  test = (RegressionTest *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffb8,"barrier_sys_regression_test","");
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_02185b78
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,test,
             (undefined1 *)((long)&test->_vptr_RegressionTest + local_40));
  if (test != (RegressionTest *)&stack0xffffffffffffffc8) {
    operator_delete(test);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_021a63d8;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threadID).super___atomic_base<unsigned_long>._M_i = 0;
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  registerRegressionTest(test);
  return;
}

Assistant:

barrier_sys_regression_test() 
      : RegressionTest("barrier_sys_regression_test"), threadID(0), numFailed(0)
    {
      registerRegressionTest(this);
    }